

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int ffiprs(fitsfile *fptr,int compressed,char *expr,int maxdim,int *datatype,long *nelem,int *naxis,
          long *naxes,ParseData *lParse,int *status)

{
  Node *pNVar1;
  uint uVar2;
  PixelFilter *pPVar3;
  Node *pNVar4;
  int *piVar5;
  long *plVar6;
  int iVar7;
  size_t sVar8;
  iteratorCol *piVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  yyscan_t yylex_scanner;
  long xaxes [9];
  int local_a0 [2];
  int *local_98;
  long *local_90;
  int local_84;
  yyscan_t local_80;
  long local_78 [9];
  
  local_a0[1] = 0;
  if (*status != 0) {
    return *status;
  }
  iVar7 = ffrdef(fptr,status);
  if (iVar7 == 0) {
    pPVar3 = lParse->pixFilter;
    local_98 = datatype;
    local_90 = nelem;
    memset(&lParse->compressed,0,0xd0);
    lParse->pixFilter = pPVar3;
    lParse->def_fptr = fptr;
    lParse->compressed = compressed;
    lParse->colData = (iteratorCol *)0x0;
    lParse->varData = (DataInfo *)0x0;
    lParse->getData = find_column;
    lParse->loadData = load_column;
    lParse->status = 0;
    lParse->Nodes = (Node *)0x0;
    lParse->nNodes = 0;
    lParse->nNodesAlloc = 0;
    ffghdt(fptr,&lParse->hdutype,status);
    if (lParse->hdutype == 0) {
      ffgipr(fptr,9,&local_84,local_a0,local_78,status);
      if (*status != 0) {
        ffpmsg("ffiprs: unable to get image dimensions");
        goto LAB_001201fc;
      }
      lVar13 = (long)local_a0[0];
      lParse->totalRows = (ulong)(0 < lVar13);
      if (lVar13 < 1) {
        lVar12 = 0;
      }
      else {
        lVar12 = 1;
        lVar10 = 0;
        do {
          lVar12 = lVar12 * local_78[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar13 != lVar10);
        lParse->totalRows = lVar12;
      }
      if (DEBUG_PIXFILTER != 0) {
        printf("naxis=%d, lParse->totalRows=%ld\n",lVar13,lVar12);
      }
    }
    else {
      iVar7 = ffgkyj(fptr,"NAXIS2",&lParse->totalRows,(char *)0x0,local_a0 + 1);
      if (iVar7 != 0) {
        lParse->totalRows = 0;
      }
    }
    if (*expr == '@') {
      iVar7 = ffimport_file(expr + 1,&lParse->expr,status);
      if (iVar7 != 0) goto LAB_001201fc;
      pcVar14 = lParse->expr;
      sVar8 = strlen(pcVar14);
      lVar13 = sVar8 << 0x20;
    }
    else {
      sVar8 = strlen(expr);
      lVar13 = sVar8 << 0x20;
      pcVar14 = (char *)malloc(lVar13 + 0x200000000 >> 0x20);
      lParse->expr = pcVar14;
      strcpy(pcVar14,expr);
    }
    pcVar14 = pcVar14 + (lVar13 >> 0x20);
    sVar8 = strlen(pcVar14);
    (pcVar14 + sVar8)[0] = '\n';
    (pcVar14 + sVar8)[1] = '\0';
    lParse->index = 0;
    lParse->is_eobuf = 0;
    fits_parser_yylex_init_extra(lParse,&local_80);
    fits_parser_yyrestart((FILE *)0x0,local_80);
    iVar7 = fits_parser_yyparse(local_80,lParse);
    *status = iVar7;
    fits_parser_yylex_destroy(local_80);
    plVar6 = local_90;
    piVar5 = local_98;
    if (*status == 0) {
      iVar7 = lParse->status;
      *status = iVar7;
      if (iVar7 != 0) {
        return iVar7;
      }
      if (lParse->nNodes != 0) {
        if (lParse->nCols == 0) {
          piVar9 = (iteratorCol *)calloc(1,0x110);
          lParse->colData = piVar9;
          if (piVar9 == (iteratorCol *)0x0) {
            ffpmsg("memory allocation failed (ffiprs)");
            *status = 0x71;
            return 0x71;
          }
          piVar9->fptr = fptr;
        }
        pNVar4 = lParse->Nodes;
        iVar7 = lParse->resultNode;
        pNVar1 = pNVar4 + iVar7;
        uVar2 = pNVar4[iVar7].value.naxis;
        lParse->nAxis = uVar2;
        *naxis = uVar2;
        lVar13 = pNVar4[iVar7].value.nelem;
        lParse->nElements = lVar13;
        *plVar6 = lVar13;
        if ((int)uVar2 < maxdim) {
          maxdim = uVar2;
        }
        if (0 < maxdim) {
          uVar11 = 0;
          do {
            lVar13 = (pNVar1->value).naxes[uVar11];
            lParse->nAxes[uVar11] = lVar13;
            naxes[uVar11] = lVar13;
            uVar11 = uVar11 + 1;
          } while ((uint)maxdim != uVar11);
        }
        switch(pNVar1->type) {
        case 0x102:
          *piVar5 = 0xe;
          iVar7 = 0xe;
          break;
        case 0x103:
          *piVar5 = 0x29;
          iVar7 = 0x29;
          break;
        case 0x104:
          *piVar5 = 0x52;
          iVar7 = 0x52;
          break;
        case 0x105:
          *piVar5 = 0x10;
          iVar7 = 0x10;
          break;
        case 0x106:
          *piVar5 = 1;
          iVar7 = 1;
          break;
        default:
          *piVar5 = 0;
          ffpmsg("Bad return data type");
          lParse->status = 0x1b0;
          *status = 0x1b0;
          iVar7 = *piVar5;
        }
        lParse->datatype = iVar7;
        if (lParse->expr == (char *)0x0) {
          printf("invalid free(lParse->expr) at %s:%d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                 ,0x3ad);
        }
        else {
          free(lParse->expr);
        }
        if (pNVar1->operation == -1000) {
          *plVar6 = -*plVar6;
        }
        goto LAB_001201fc;
      }
      ffpmsg("Blank expression");
    }
    *status = 0x1af;
    iVar7 = 0x1af;
  }
  else {
LAB_001201fc:
    iVar7 = *status;
  }
  return iVar7;
}

Assistant:

int ffiprs( fitsfile *fptr,      /* I - Input FITS file                     */
            int      compressed, /* I - Is FITS file hkunexpanded?          */
            char     *expr,      /* I - Arithmetic expression               */
            int      maxdim,     /* I - Max Dimension of naxes              */
            int      *datatype,  /* O - Data type of result                 */
            long     *nelem,     /* O - Vector length of result             */
            int      *naxis,     /* O - # of dimensions of result           */
            long     *naxes,     /* O - Size of each dimension              */
	    ParseData *lParse,   /* O - parser status                       */
            int      *status )   /* O - Error status                        */
/*                                                                          */
/* Initialize the parser and determine what type of result the expression   */
/* produces.                                                                */
/*--------------------------------------------------------------------------*/
{
   Node *result;
   int  i,lexpr, tstatus = 0;
   int xaxis, bitpix;
   long xaxes[9];
   yyscan_t yylex_scanner; /* Used internally by FLEX lexer */
   PixelFilter *pixFilter = 0;

   if( *status ) return( *status );

   /* make sure all internal structures for this HDU are current */
   if ( ffrdef(fptr, status) ) return(*status);

   /*  Initialize the Parser structure  */

   /* Unfortunately we need to preserve the pixFilter value since it
      is pre-set when ffiprs() is called */
   pixFilter = lParse->pixFilter;
   memset(lParse, 0, sizeof(*lParse));
   lParse->pixFilter = pixFilter;

   lParse->def_fptr   = fptr;
   lParse->compressed = compressed;
   lParse->nCols      = 0;
   lParse->colData    = NULL;
   lParse->varData    = NULL;
   lParse->getData    = find_column;
   lParse->loadData   = load_column;
   lParse->Nodes      = NULL;
   lParse->nNodesAlloc= 0;
   lParse->nNodes     = 0;
   lParse->hdutype    = 0;
   lParse->status     = 0;

   fits_get_hdu_type(fptr, &(lParse->hdutype), status );

   if (lParse->hdutype == IMAGE_HDU) {

      fits_get_img_param(fptr, 9, &bitpix, &xaxis, xaxes, status);
      if (*status) {
         ffpmsg("ffiprs: unable to get image dimensions");
         return( *status );
      }
      lParse->totalRows = xaxis > 0 ? 1 : 0;
      for (i = 0; i < xaxis; ++i)
         lParse->totalRows *= xaxes[i];
      if (DEBUG_PIXFILTER)
         printf("naxis=%d, lParse->totalRows=%ld\n", xaxis, lParse->totalRows);
   }
   else if( ffgkyj(fptr, "NAXIS2", &lParse->totalRows, 0, &tstatus) )
   {
      /* this might be a 1D or null image with no NAXIS2 keyword */
      lParse->totalRows = 0;
   } 
   

   /*  Copy expression into parser... read from file if necessary  */


   if( expr[0]=='@' ) {
      if( ffimport_file( expr+1, &lParse->expr, status ) ) return( *status );
      lexpr = strlen(lParse->expr);
   } else {
      lexpr = strlen(expr);
      lParse->expr = (char*)malloc( (2+lexpr)*sizeof(char));
      strcpy(lParse->expr,expr);
   }
   strcat(lParse->expr + lexpr,"\n");
   lParse->index    = 0;
   lParse->is_eobuf = 0;

   /*  Parse the expression, building the Nodes and determing  */
   /*  which columns are needed and what data type is returned  */
   
   fits_parser_yylex_init_extra(lParse, &yylex_scanner);
   fits_parser_yyrestart(NULL, yylex_scanner);
   *status = fits_parser_yyparse(yylex_scanner, lParse);
   fits_parser_yylex_destroy(yylex_scanner);

   if( *status  ) return( *status = PARSE_SYNTAX_ERR );

   /*  Check results  */
   *status = lParse->status;
   if( *status ) return(*status);

   if( !lParse->nNodes ) {
      ffpmsg("Blank expression");
      return( *status = PARSE_SYNTAX_ERR );
   }
   if( !lParse->nCols ) {
     lParse->colData = (iteratorCol *) malloc(sizeof(iteratorCol));
     if (lParse->colData == 0) {
       ffpmsg("memory allocation failed (ffiprs)");
       return( *status = MEMORY_ALLOCATION );
     }
     /* This allows iterator to know value of */ 
     /* fptr when no columns are referenced   */
     memset(lParse->colData, 0, sizeof(iteratorCol));
     lParse->colData[0].fptr = fptr;
   }

   result = lParse->Nodes + lParse->resultNode;

   *naxis = lParse->nAxis     = result->value.naxis;
   *nelem = lParse->nElements = result->value.nelem;
   for( i=0; i<*naxis && i<maxdim; i++ )
      naxes[i] = lParse->nAxes[i] = result->value.naxes[i];

   switch( result->type ) {
   case BOOLEAN:
      *datatype = TLOGICAL;
      break;
   case LONG:
      *datatype = TLONG;
      break;
   case DOUBLE:
      *datatype = TDOUBLE;
      break;
   case BITSTR:
      *datatype = TBIT;
      break;
   case STRING:
      *datatype = TSTRING;
      break;
   default:
      *datatype = 0;
      ffpmsg("Bad return data type");
      *status = lParse->status = PARSE_BAD_TYPE;
      break;
   }
   lParse->datatype = *datatype;
   FREE(lParse->expr);

   if( result->operation==CONST_OP ) *nelem = - *nelem;
   return(*status);
}